

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall icu_63::RuleBasedNumberFormat::setLenient(RuleBasedNumberFormat *this,UBool enabled)

{
  UBool enabled_local;
  RuleBasedNumberFormat *this_local;
  
  this->lenient = enabled;
  if ((enabled == '\0') && (this->collator != (RuleBasedCollator *)0x0)) {
    if (this->collator != (RuleBasedCollator *)0x0) {
      (*(this->collator->super_Collator).super_UObject._vptr_UObject[1])();
    }
    this->collator = (RuleBasedCollator *)0x0;
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::setLenient(UBool enabled)
{
    lenient = enabled;
    if (!enabled && collator) {
        delete collator;
        collator = NULL;
    }
}